

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xform.cc
# Opt level: O0

matrix3d * tinyusdz::to_matrix3x3(matrix3d *__return_storage_ptr__,quath *q)

{
  const_reference pvVar1;
  V *this;
  double *__src;
  float fVar2;
  double local_b0;
  uint16_t local_a2;
  double local_a0;
  uint16_t local_92;
  double local_90;
  uint16_t local_82;
  double local_80;
  vec<double,_4> local_78;
  undefined1 local_58 [8];
  double3x3 m33;
  quath *q_local;
  
  m33.z.z = (double)q;
  pvVar1 = ::std::array<tinyusdz::value::half,_3UL>::operator[](&q->imag,0);
  local_82 = pvVar1->value;
  fVar2 = value::half_to_float((half)local_82);
  local_80 = (double)fVar2;
  pvVar1 = ::std::array<tinyusdz::value::half,_3UL>::operator[]
                     ((array<tinyusdz::value::half,_3UL> *)m33.z.z,1);
  local_92 = pvVar1->value;
  fVar2 = value::half_to_float((half)local_92);
  local_90 = (double)fVar2;
  pvVar1 = ::std::array<tinyusdz::value::half,_3UL>::operator[]
                     ((array<tinyusdz::value::half,_3UL> *)m33.z.z,2);
  local_a2 = pvVar1->value;
  fVar2 = value::half_to_float((half)local_a2);
  local_a0 = (double)fVar2;
  fVar2 = value::half_to_float((half)*(uint16_t *)((long)m33.z.z + 6));
  local_b0 = (double)fVar2;
  linalg::vec<double,_4>::vec(&local_78,&local_80,&local_90,&local_a0,&local_b0);
  linalg::qmat<double>((mat<double,_3,_3> *)local_58,&local_78);
  value::matrix3d::matrix3d(__return_storage_ptr__);
  Identity(__return_storage_ptr__);
  this = linalg::mat<double,_3,_3>::operator[]((mat<double,_3,_3> *)local_58,0);
  __src = linalg::vec<double,_3>::operator[](this,0);
  memcpy(__return_storage_ptr__,__src,0x48);
  return __return_storage_ptr__;
}

Assistant:

value::matrix3d to_matrix3x3(const value::quath &q) {
  double3x3 m33 = linalg::qmat<double>(
      {double(half_to_float(q.imag[0])), double(half_to_float(q.imag[1])),
       double(half_to_float(q.imag[2])), double(half_to_float(q.real))});

  value::matrix3d m;
  Identity(&m);

  memcpy(m.m, &m33[0][0], sizeof(double) * 3 * 3);

  return m;
}